

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O3

int g2d_polygon_rasterize(zarray_t *poly,double y,double *x)

{
  double *pdVar1;
  size_t sVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double *p0;
  double *pdVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double q [2];
  double local_98 [2];
  g2d_line_t local_88;
  g2d_line_segment_t local_68;
  
  if (poly == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                  ,0x84,"int zarray_size(const zarray_t *)");
  }
  lVar11 = (long)poly->size;
  local_88.p[0] = 0.0;
  dVar5 = y - y;
  dVar7 = (double)SQRT((float)(dVar5 * dVar5 + 1.0));
  auVar15._8_8_ = dVar5;
  auVar15._0_8_ = 0x3ff0000000000000;
  auVar6._8_8_ = dVar7;
  auVar6._0_8_ = dVar7;
  local_88.u = (double  [2])divpd(auVar15,auVar6);
  local_88.p[1] = y;
  if (lVar11 < 1) {
    iVar10 = 0;
  }
  else {
    sVar2 = poly->el_sz;
    pdVar3 = (double *)poly->data;
    iVar10 = 0;
    pdVar12 = pdVar3;
    lVar13 = 1;
    do {
      lVar9 = 0;
      if (lVar13 != lVar11) {
        lVar9 = lVar13;
      }
      local_68.line.p[0] = *pdVar12;
      local_68.line.p[1] = pdVar12[1];
      pdVar1 = (double *)((long)pdVar3 + lVar9 * sVar2);
      local_68.p1[0] = *pdVar1;
      local_68.p1[1] = pdVar1[1];
      auVar16._0_8_ = local_68.p1[0] - local_68.line.p[0];
      auVar16._8_8_ = local_68.p1[1] - local_68.line.p[1];
      dVar5 = (double)SQRT((float)(auVar16._8_8_ * auVar16._8_8_ + auVar16._0_8_ * auVar16._0_8_));
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = dVar5;
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      local_68.line.u = (double  [2])divpd(auVar16,auVar4);
      iVar8 = g2d_line_segment_intersect_line(&local_68,&local_88,local_98);
      if (iVar8 != 0) {
        lVar9 = (long)iVar10;
        iVar10 = iVar10 + 1;
        x[lVar9] = local_98[0];
      }
      pdVar12 = (double *)((long)pdVar12 + sVar2);
      bVar14 = lVar13 != lVar11;
      lVar13 = lVar13 + 1;
    } while (bVar14);
  }
  qsort(x,(long)iVar10,8,double_sort_up);
  return iVar10;
}

Assistant:

int g2d_polygon_rasterize(const zarray_t *poly, double y, double *x)
{
    int sz = zarray_size(poly);

    g2d_line_t line;
    if (1) {
        double p0[2] = { 0, y };
        double p1[2] = { 1, y };

        g2d_line_init_from_points(&line, p0, p1);
    }

    int xpos = 0;

    for (int i = 0; i < sz; i++) {
        g2d_line_segment_t seg;
        double *p0, *p1;
        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1)%sz, &p1);

        g2d_line_segment_init_from_points(&seg, p0, p1);

        double q[2];
        if (g2d_line_segment_intersect_line(&seg, &line, q))
            x[xpos++] = q[0];
    }

    qsort(x, xpos, sizeof(double), double_sort_up);

    return xpos;
}